

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

char * __thiscall SQLite::Statement::getColumnDeclaredType(Statement *this,int aIndex)

{
  sqlite3_stmt *pStmt;
  char *pcVar1;
  Exception *this_00;
  char *result;
  int aIndex_local;
  Statement *this_local;
  
  checkIndex(this,aIndex);
  pStmt = getPreparedStatement(this);
  pcVar1 = sqlite3_column_decltype(pStmt,aIndex);
  if (pcVar1 == (char *)0x0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,"Could not determine declared column type.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return pcVar1;
}

Assistant:

const char* Statement::getColumnDeclaredType(const int aIndex) const
{
    checkIndex(aIndex);
    const char * result = sqlite3_column_decltype(getPreparedStatement(), aIndex);
    if (!result)
    {
        throw SQLite::Exception("Could not determine declared column type.");
    }
    else
    {
        return result;
    }
}